

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_connection.cc
# Opt level: O0

int __thiscall iqnet::ssl::Connection::shutdown(Connection *this,int __fd,int __how)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined7 extraout_var;
  int ret;
  Connection *this_local;
  
  bVar1 = shutdown_recved(this);
  if (bVar1) {
    bVar1 = shutdown_sent(this);
    if (bVar1) {
      return (int)CONCAT71(extraout_var,bVar1);
    }
  }
  iVar2 = SSL_shutdown((SSL *)this->ssl);
  if (iVar2 == 0) {
    SSL_shutdown((SSL *)this->ssl);
    SSL_set_shutdown((SSL *)this->ssl,2);
    iVar2 = extraout_EAX;
  }
  else if (iVar2 == 1) {
    iVar2 = 0;
  }
  else {
    throw_io_exception(this->ssl,iVar2);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void ssl::Connection::shutdown()
{
  if( shutdown_recved() && shutdown_sent() )
    return;

  int ret = SSL_shutdown( ssl );
  switch( ret )
  {
    case 1:
      return;

    case 0:
      SSL_shutdown( ssl );
      SSL_set_shutdown( ssl, SSL_RECEIVED_SHUTDOWN );
      break;

    default:
      throw_io_exception( ssl, ret );
  }
}